

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O2

_Bool gen_iblock(int K,int T,int n_ESIs,uint32_t *ESIs)

{
  uint uVar1;
  void *__ptr;
  void *__ptr_00;
  size_t sVar2;
  void *__ptr_01;
  long lVar3;
  char *pcVar4;
  _Bool _Var5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  undefined8 uStack_60;
  void *local_58;
  size_t prog_sz;
  size_t inter_sym_num;
  size_t work_sz;
  
  uVar6 = (ulong)(uint)K;
  if (n_ESIs < K) {
    fprintf(_stderr,"Error:  Insufficient number of Symbols.\n        K=%d, #ESIs=%d\n",uVar6,
            (ulong)(uint)n_ESIs);
  }
  else {
    uVar1 = RqInterGetMemSizes(uVar6,n_ESIs - K,&work_sz,&prog_sz,&inter_sym_num);
    if (uVar1 == 0) {
      __ptr = malloc(work_sz);
      local_58 = malloc(prog_sz);
      uVar1 = RqInterInit(uVar6,n_ESIs - K,__ptr,work_sz);
      if (uVar1 == 0) {
        uVar8 = 0;
        uVar6 = 0;
        if (0 < n_ESIs) {
          uVar6 = (ulong)(uint)n_ESIs;
        }
        do {
          if (uVar6 == uVar8) {
            uVar1 = RqInterCompile(__ptr,local_58,prog_sz);
            if (uVar1 != 0) {
              pcVar4 = "RqInterCompile(wrk, prog, prog_sz)";
              uStack_60 = 0x50;
              goto LAB_00101505;
            }
            lVar3 = (long)T;
            sVar7 = n_ESIs * lVar3;
            __ptr_00 = malloc(sVar7);
            sVar2 = fread(__ptr_00,1,sVar7,_stdin);
            if (sVar2 != sVar7) {
              fwrite("Error:  fread() returned a short count.\n",0x28,1,_stderr);
              __ptr_01 = (void *)0x0;
              goto LAB_00101534;
            }
            sVar2 = inter_sym_num * lVar3;
            __ptr_01 = malloc(sVar2);
            uVar1 = RqInterExecute(local_58,lVar3,__ptr_00,sVar7,__ptr_01,sVar2);
            if (uVar1 != 0) {
              _Var5 = false;
              fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                      ,0x5e,"RqInterExecute(prog, T, indata, indata_sz, outdata, outdata_sz)",
                      (ulong)uVar1);
              goto LAB_00101537;
            }
            sVar7 = fwrite(__ptr_01,1,sVar2,_stdout);
            _Var5 = true;
            if (sVar7 == sVar2) goto LAB_00101537;
            fwrite("Error:  fwrite() returned a short count.\n",0x29,1,_stderr);
            goto LAB_00101534;
          }
          uVar1 = RqInterAddIds(__ptr,ESIs[uVar8],1);
          uVar8 = uVar8 + 1;
        } while (uVar1 == 0);
        pcVar4 = "RqInterAddIds(wrk, ESIs[i], 1)";
        uStack_60 = 0x4f;
      }
      else {
        pcVar4 = "RqInterInit(K, nExtra, wrk, work_sz)";
        uStack_60 = 0x4d;
      }
LAB_00101505:
      __ptr_01 = (void *)0x0;
      fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
              ,uStack_60,pcVar4,(ulong)uVar1);
      __ptr_00 = (void *)0x0;
      goto LAB_00101534;
    }
    fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
            ,0x49,"RqInterGetMemSizes(K, nExtra, &work_sz, &prog_sz, &inter_sym_num)",(ulong)uVar1);
  }
  __ptr_01 = (void *)0x0;
  __ptr_00 = (void *)0x0;
  local_58 = (void *)0x0;
  __ptr = (void *)0x0;
LAB_00101534:
  _Var5 = false;
LAB_00101537:
  free(__ptr_01);
  free(__ptr_00);
  free(local_58);
  free(__ptr);
  return _Var5;
}

Assistant:

bool gen_iblock(int K, int T, int n_ESIs, uint32_t* ESIs)
{
	bool success = false;

	RqInterWorkMem* wrk = NULL;
	RqInterProgram* prog = NULL;
	void* indata = NULL;
	void* outdata = NULL;

	if (n_ESIs < K) {
		fprintf(stderr, "Error:  Insufficient number of Symbols.\n"
		                "        K=%d, #ESIs=%d\n", K, n_ESIs);
		goto xit;
	}

	int nExtra = n_ESIs - K;
	size_t work_sz, prog_sz, inter_sym_num;
	RUN_NOFAIL(RqInterGetMemSizes(K,
				nExtra,
				&work_sz,
				&prog_sz,
				&inter_sym_num), xit);
	wrk = malloc(work_sz);
	prog = malloc(prog_sz);

	RUN_NOFAIL(RqInterInit(K, nExtra, wrk, work_sz), xit);
	for (int i = 0; i < n_ESIs; ++i)
		RUN_NOFAIL(RqInterAddIds(wrk, ESIs[i], 1), xit);
	RUN_NOFAIL(RqInterCompile(wrk, prog, prog_sz), xit);

	/* Read source data */
	size_t indata_sz = T * (size_t)n_ESIs;
	indata = malloc(indata_sz);
	size_t ret = fread(indata, 1, indata_sz, stdin);
	if (ret != indata_sz) {
		fprintf(stderr, "Error:  fread() returned a short count.\n");
		goto xit;
	}

	/* Generate iblock data */
	size_t outdata_sz = inter_sym_num * T;
	outdata = malloc(outdata_sz);
	RUN_NOFAIL(RqInterExecute(prog, T, indata, indata_sz, outdata, outdata_sz), xit);

	/* Print them to stdout */
	size_t out_written = fwrite(outdata, 1, outdata_sz, stdout);
	if (out_written != outdata_sz) {
		fprintf(stderr, "Error:  fwrite() returned a short count.\n");
		goto xit;
	}

	/* Done */
	success = true;
xit:
	if (outdata)		free(outdata);
	if (indata)		free(indata);
	if (prog)		free(prog);
	if (wrk)		free(wrk);
	return success;
}